

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

natwm_error string_splice(char *string,size_t start,size_t end,char **destination,size_t *size)

{
  size_t sVar1;
  char *__dest;
  natwm_error nVar2;
  size_t __n;
  
  __n = end - start;
  nVar2 = INVALID_INPUT_ERROR;
  if (start <= end && string != (char *)0x0) {
    sVar1 = strlen(string);
    if (end <= sVar1) {
      __dest = (char *)malloc(__n + 1);
      *destination = __dest;
      if (__dest == (char *)0x0) {
        nVar2 = MEMORY_ALLOCATION_ERROR;
      }
      else {
        memcpy(__dest,string + start,__n);
        __dest[__n] = '\0';
        nVar2 = NO_ERROR;
        if (size != (size_t *)0x0) {
          *size = __n;
        }
      }
    }
  }
  return nVar2;
}

Assistant:

enum natwm_error string_splice(const char *string, size_t start, size_t end, char **destination,
                               size_t *size)
{
        if (string == NULL || end < start || end > strlen(string)) {
                return INVALID_INPUT_ERROR;
        }

        size_t result_size = end - start;

        *destination = malloc(result_size + 1);

        if (*destination == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        memcpy(*destination, string + start, result_size);

        (*destination)[result_size] = '\0';

        SET_IF_NON_NULL(size, result_size);

        return NO_ERROR;
}